

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsItemPrivate::appendGraphicsTransform(QGraphicsItemPrivate *this,QGraphicsTransform *t)

{
  long lVar1;
  long *plVar2;
  TransformData *pTVar3;
  long lVar4;
  long lVar5;
  qreal *pqVar6;
  TransformData *pTVar7;
  long in_FS_OFFSET;
  byte bVar8;
  QGraphicsTransform *local_28;
  long local_20;
  
  bVar8 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar3 = this->transformData;
  if (pTVar3 == (TransformData *)0x0) {
    pTVar3 = (TransformData *)operator_new(0x90);
    pqVar6 = (qreal *)&DAT_006f1e88;
    pTVar7 = pTVar3;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pTVar7->transform).m_matrix[0][0] = *pqVar6;
      pqVar6 = pqVar6 + (ulong)bVar8 * -2 + 1;
      pTVar7 = (TransformData *)((long)pTVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    *(undefined2 *)&(pTVar3->transform).field_0x48 = 0;
    pTVar3->scale = 1.0;
    pTVar3->rotation = 0.0;
    pTVar3->xOrigin = 0.0;
    pTVar3->yOrigin = 0.0;
    (pTVar3->graphicsTransforms).d.d = (Data *)0x0;
    (pTVar3->graphicsTransforms).d.ptr = (QGraphicsTransform **)0x0;
    (pTVar3->graphicsTransforms).d.size = 0;
    pTVar3->onlyTransform = true;
    this->transformData = pTVar3;
  }
  lVar4 = (pTVar3->graphicsTransforms).d.size;
  if (lVar4 != 0) {
    lVar5 = 0;
    do {
      if (lVar4 * 8 - lVar5 == 0) goto LAB_005dd9ca;
      lVar1 = lVar5 + 8;
      plVar2 = (long *)((long)(pTVar3->graphicsTransforms).d.ptr + lVar5);
      lVar5 = lVar1;
    } while ((QGraphicsTransform *)*plVar2 != t);
    if (lVar1 != 0) goto LAB_005dd9e4;
  }
LAB_005dd9ca:
  local_28 = t;
  QtPrivate::QPodArrayOps<QGraphicsTransform*>::emplace<QGraphicsTransform*&>
            ((QPodArrayOps<QGraphicsTransform*> *)&pTVar3->graphicsTransforms,lVar4,&local_28);
  QList<QGraphicsTransform_*>::end(&pTVar3->graphicsTransforms);
LAB_005dd9e4:
  QGraphicsTransformPrivate::setItem(*(QGraphicsTransformPrivate **)&t->field_0x8,this->q_ptr);
  this->transformData->onlyTransform = false;
  this->field_0x166 = this->field_0x166 | 0x20;
  (*this->_vptr_QGraphicsItemPrivate[4])(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemPrivate::appendGraphicsTransform(QGraphicsTransform *t)
{
    if (!transformData)
        transformData = new QGraphicsItemPrivate::TransformData;
    if (!transformData->graphicsTransforms.contains(t))
        transformData->graphicsTransforms.append(t);

    Q_Q(QGraphicsItem);
    t->d_func()->setItem(q);
    transformData->onlyTransform = false;
    dirtySceneTransform = 1;
    transformChanged();
}